

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O1

void __thiscall
boost::python::
class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
::
initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
          (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
           *this,init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
                 *i)

{
  type_info local_30;
  type_info local_28;
  
  converter::registry::insert
            (converter::shared_ptr_from_python<LFPConsumer,_boost::shared_ptr>::convertible,
             converter::shared_ptr_from_python<LFPConsumer,_boost::shared_ptr>::construct,
             (type_info)"N5boost10shared_ptrI11LFPConsumerEE",
             converter::expected_from_python_type_direct<LFPConsumer>::get_pytype);
  converter::registry::insert
            (converter::shared_ptr_from_python<LFPConsumer,_std::shared_ptr>::convertible,
             converter::shared_ptr_from_python<LFPConsumer,_std::shared_ptr>::construct,
             (type_info)"St10shared_ptrI11LFPConsumerE",
             converter::expected_from_python_type_direct<LFPConsumer>::get_pytype);
  objects::register_dynamic_id_aux
            ((type_info)0x362875,objects::polymorphic_id_generator<LFPConsumer>::execute);
  mpl::aux::for_each_impl<false>::
  execute<boost::mpl::v_iter<boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,0l>,boost::mpl::v_iter<boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,1l>,std::add_pointer<mpl_::arg<_1>>,boost::python::objects::register_base_of<LFPConsumer>>
            (0,0,0);
  converter::registry::insert
            (converter::shared_ptr_from_python<LFPConsumer_python,_boost::shared_ptr>::convertible,
             converter::shared_ptr_from_python<LFPConsumer_python,_boost::shared_ptr>::construct,
             (type_info)"N5boost10shared_ptrI18LFPConsumer_pythonEE",
             converter::expected_from_python_type_direct<LFPConsumer_python>::get_pytype);
  converter::registry::insert
            (converter::shared_ptr_from_python<LFPConsumer_python,_std::shared_ptr>::convertible,
             converter::shared_ptr_from_python<LFPConsumer_python,_std::shared_ptr>::construct,
             (type_info)"St10shared_ptrI18LFPConsumer_pythonE",
             converter::expected_from_python_type_direct<LFPConsumer_python>::get_pytype);
  objects::register_dynamic_id_aux
            ((type_info)"18LFPConsumer_python",
             objects::polymorphic_id_generator<LFPConsumer_python>::execute);
  mpl::aux::for_each_impl<false>::
  execute<boost::mpl::aux::sel_iter<LFPConsumer,0>,boost::mpl::aux::sel_iter<LFPConsumer,1>,std::add_pointer<mpl_::arg<_1>>,boost::python::objects::register_base_of<LFPConsumer_python>>
            (0,0,0);
  local_28.m_base_type = "11LFPConsumer";
  local_30.m_base_type = "18LFPConsumer_python";
  objects::copy_class_object(&local_28,&local_30);
  objects::class_base::set_instance_size((class_base *)this,0x458);
  detail::define_class_init_helper<0>::
  apply<boost::python::class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector3<HighFreqDataType,int,HFParsingInfo>,boost::mpl::size<boost::mpl::vector3<HighFreqDataType,int,HFParsingInfo>>>
            (this,&local_28,&local_30,i->m_doc,&i->m_keywords);
  return;
}

Assistant:

inline void initialize(DefVisitor const& i)
    {
        metadata::register_(); // set up runtime metadata/conversions
        
        typedef typename metadata::holder holder;
        this->set_instance_size( objects::additional_instance_size<holder>::value );
        
        this->def(i);
    }